

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void CTcTokenizer::skip_ws_and_markers(utf8_ptr *p)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  utf8_ptr *in_RDI;
  wchar_t cur;
  undefined4 in_stack_fffffffffffffff0;
  
  while( true ) {
    while (wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e4c43), wVar1 == L'\x03') {
      pcVar3 = utf8_ptr::getptr(in_RDI);
      utf8_ptr::set(in_RDI,pcVar3 + 9);
    }
    iVar2 = is_space(L'\0');
    if (iVar2 == 0) break;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(wVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void CTcTokenizer::skip_ws_and_markers(utf8_ptr *p)
{
    /* keep going until we find something interesting */
    for (;;)
    {
        wchar_t cur;

        /* get the current character */
        cur = p->getch();

        /* 
         *   if it's a macro expansion end marker, skip it as though it
         *   were whitespace; otherwise, if it's whitespace, skip it;
         *   otherwise, we're done skipping leading whitespace 
         */
        if (cur == TOK_MACRO_EXP_END)
        {
            /* skip the embedded pointer value that follows */
            p->set(p->getptr() + 1 + sizeof(CTcHashEntryPp *));
        }
        else if (is_space(cur))
        {
            /* skip the space */
            p->inc();
        }
        else
        {
            /* it's not whitespace or equivalent - we're done */
            return;
        }
    }
}